

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# misc_utils.cc
# Opt level: O3

bool sptk::ComputePercentagePointOfTDistribution
               (double probability,int degrees_of_freedom,double *percentage_point)

{
  double dVar1;
  bool bVar2;
  bool bVar3;
  undefined8 *puVar4;
  ulong uVar5;
  int iVar6;
  long lVar7;
  int iVar8;
  int iVar9;
  undefined4 *puVar10;
  double *pdVar11;
  int iVar12;
  int iVar13;
  long lVar14;
  value_type_conflict *__val;
  byte bVar15;
  undefined4 in_XMM0_Dc;
  undefined4 in_XMM0_Dd;
  initializer_list<int> __l;
  double z;
  vector<int,_std::allocator<int>_> parameters;
  double computed_probability;
  allocator_type local_d1;
  double local_d0;
  undefined1 local_c8 [16];
  double local_b8;
  double local_b0;
  double local_a8;
  vector<int,_std::allocator<int>_> local_a0;
  double local_88 [13];
  
  bVar15 = 0;
  if ((percentage_point != (double *)0x0 && 0 < degrees_of_freedom) &&
      (0.0 < probability && probability < 1.0)) {
    if ((probability == 0.5) && (!NAN(probability))) {
      *percentage_point = 0.0;
      return true;
    }
    local_c8._8_4_ = in_XMM0_Dc;
    local_c8._0_8_ = probability;
    local_c8._12_4_ = in_XMM0_Dd;
    bVar2 = ComputePercentagePointOfStandardNormalDistribution(probability,&local_b0);
    if (bVar2) {
      local_d0 = local_b0;
      puVar10 = &DAT_00112d68;
      pdVar11 = local_88;
      for (lVar7 = 0x19; lVar7 != 0; lVar7 = lVar7 + -1) {
        *(undefined4 *)pdVar11 = *puVar10;
        puVar10 = puVar10 + (ulong)bVar15 * -2 + 1;
        pdVar11 = (double *)((long)pdVar11 + ((ulong)bVar15 * -2 + 1) * 4);
      }
      __l._M_len = 0x19;
      __l._M_array = (iterator)local_88;
      std::vector<int,_std::allocator<int>_>::vector(&local_a0,__l,&local_d1);
      puVar4 = (undefined8 *)operator_new(0x28);
      puVar4[2] = 0;
      puVar4[3] = 0;
      *puVar4 = 0;
      puVar4[1] = 0;
      puVar4[4] = 0;
      lVar7 = 0;
      iVar6 = 1;
      iVar8 = 3;
      iVar9 = 1;
      iVar13 = 0;
      do {
        dVar1 = (double)local_a0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start[iVar13];
        puVar4[lVar7] = dVar1;
        iVar12 = iVar13 + 1;
        lVar14 = 0;
        do {
          dVar1 = (double)local_a0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start[iVar9 + lVar14] +
                  dVar1 * local_d0 * local_d0;
          lVar14 = lVar14 + 1;
        } while (iVar6 != (int)lVar14);
        iVar13 = iVar12 + (int)lVar7 + 2;
        puVar4[lVar7] =
             dVar1 / (double)local_a0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start[iVar6 + iVar12];
        lVar7 = lVar7 + 1;
        iVar6 = iVar6 + 1;
        iVar9 = iVar9 + iVar8;
        iVar8 = iVar8 + 1;
      } while (lVar7 != 5);
      local_d0 = (double)degrees_of_freedom;
      dVar1 = 0.0;
      uVar5 = 6;
      do {
        dVar1 = (dVar1 + (double)puVar4[uVar5 - 2]) * (1.0 / local_d0);
        uVar5 = uVar5 - 1;
      } while (1 < uVar5);
      *percentage_point = (dVar1 + 1.0) * local_b0;
      dVar1 = 1.0 - (double)local_c8._0_8_;
      local_c8._0_8_ = dVar1;
      dVar1 = log10(dVar1);
      bVar2 = true;
      if (local_d0 <= dVar1 * dVar1 + 3.0) {
        bVar3 = ComputeProbabilityOfTDistribution(*percentage_point,degrees_of_freedom,local_88);
        if (bVar3) {
          local_b8 = (double)(degrees_of_freedom + 1);
          local_a8 = log(local_b8 / (*percentage_point * *percentage_point + local_d0));
          dVar1 = log(local_d0 / (local_b8 * 6.283185307179586));
          local_c8._0_8_ = local_88[0] - (double)local_c8._0_8_;
          dVar1 = exp((dVar1 + local_a8 * local_b8 + -1.0 + -1.0 / (local_b8 * 6.0 * local_d0)) *
                      0.5);
          *percentage_point = *percentage_point - (double)local_c8._0_8_ / dVar1;
        }
        else {
          bVar2 = false;
        }
      }
      operator_delete(puVar4);
      if (local_a0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start == (pointer)0x0) {
        return bVar2;
      }
      operator_delete(local_a0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start);
      return bVar2;
    }
  }
  return false;
}

Assistant:

bool ComputePercentagePointOfTDistribution(double probability,
                                           int degrees_of_freedom,
                                           double* percentage_point) {
  if (probability <= 0.0 || 1.0 <= probability || degrees_of_freedom <= 0 ||
      NULL == percentage_point) {
    return false;
  }

  if (0.5 == probability) {
    *percentage_point = 0.0;
    return true;
  }

  double z;
  if (!ComputePercentagePointOfStandardNormalDistribution(probability, &z)) {
    return false;
  }
  const double z_squared(z * z);
  const std::vector<int> parameters{1,     1,     4,     5,     16,  3,   96,
                                    3,     19,    17,    -15,   384, 79,  776,
                                    1482,  -1920, -945,  92160, 27,  339, 930,
                                    -1782, -765,  17955, 368640};

  std::vector<double> term(5);
  for (int i(0), index(0); i < static_cast<int>(term.size()); ++i) {
    term[i] = parameters[index++];
    for (int j(0); j <= i; ++j) {
      term[i] = term[i] * z_squared + parameters[index++];
    }
    term[i] /= parameters[index++];
  }

  const double inverse_degrees_of_freedom(1.0 / degrees_of_freedom);
  *percentage_point = 0.0;
  for (int i(static_cast<int>(term.size()) - 1); 0 <= i; --i) {
    *percentage_point =
        (*percentage_point + term[i]) * inverse_degrees_of_freedom;
  }
  *percentage_point = (*percentage_point + 1.0) * z;

  if (degrees_of_freedom <=
      std::pow(std::log10(1.0 - probability), 2.0) + 3.0) {
    const double n(degrees_of_freedom + 1);
    double computed_probability;
    if (!ComputeProbabilityOfTDistribution(
            *percentage_point, degrees_of_freedom, &computed_probability)) {
      return false;
    }
    const double percentage_point_squared(*percentage_point *
                                          *percentage_point);
    const double tmp1(
        std::log(n / (degrees_of_freedom + percentage_point_squared)));
    const double tmp2(std::log(degrees_of_freedom / (n * sptk::kTwoPi)));
    const double tmp3(1.0 / (6.0 * n * degrees_of_freedom));
    const double delta((computed_probability - (1.0 - probability)) /
                       std::exp((n * tmp1 + tmp2 - 1.0 - tmp3) / 2.0));
    *percentage_point -= delta;
  }
  return true;
}